

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementScroll.cpp
# Opt level: O2

void __thiscall Rml::ElementScroll::ElementScroll(ElementScroll *this,Element *_element)

{
  Scrollbar::Scrollbar(this->scrollbars);
  Scrollbar::Scrollbar(this->scrollbars + 1);
  this->element = _element;
  this->corner = (Element *)0x0;
  return;
}

Assistant:

ElementScroll::ElementScroll(Element* _element)
{
	element = _element;
	corner = nullptr;
}